

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

__int_type __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
get_node_count<(unodb::node_type)0>
          (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this)

{
  const_reference pvVar1;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  memory_order __b;
  
  pvVar1 = std::array<std::atomic<unsigned_long>,_5UL>::operator[](&this->node_counts,0);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return (pvVar1->super___atomic_base<unsigned_long>)._M_i;
}

Assistant:

[[nodiscard]] auto get_node_count() const noexcept {
    return node_counts[as_i<NodeType>].load(std::memory_order_relaxed);
  }